

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.h
# Opt level: O0

void __thiscall FeatureSet::~FeatureSet(FeatureSet *this)

{
  FeatureSet *this_local;
  
  std::vector<int,_std::allocator<int>_>::~vector(&this->ages);
  std::vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~vector(&this->points);
  return;
}

Assistant:

int size(){
        return points.size();
    }